

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScatteringRadiusCovariances.test.cpp
# Opt level: O2

void verifyChunk(ScatteringRadiusCovariances *chunk)

{
  int iVar1;
  ListRecord *pLVar2;
  long lVar3;
  StringRef macroName;
  StringRef macroName_00;
  StringRef macroName_01;
  StringRef macroName_02;
  StringRef macroName_03;
  StringRef macroName_04;
  StringRef macroName_05;
  StringRef macroName_06;
  StringRef macroName_07;
  StringRef macroName_08;
  StringRef macroName_09;
  StringRef macroName_10;
  StringRef macroName_11;
  StringRef macroName_12;
  StringRef macroName_13;
  StringRef macroName_14;
  StringRef macroName_15;
  StringRef macroName_16;
  StringRef macroName_17;
  StringRef macroName_18;
  StringRef capturedExpression;
  StringRef capturedExpression_00;
  StringRef capturedExpression_01;
  StringRef capturedExpression_02;
  StringRef capturedExpression_03;
  StringRef capturedExpression_04;
  StringRef capturedExpression_05;
  StringRef capturedExpression_06;
  StringRef capturedExpression_07;
  StringRef capturedExpression_08;
  StringRef capturedExpression_09;
  StringRef capturedExpression_10;
  StringRef capturedExpression_11;
  StringRef capturedExpression_12;
  StringRef capturedExpression_13;
  StringRef capturedExpression_14;
  StringRef capturedExpression_15;
  StringRef capturedExpression_16;
  StringRef capturedExpression_17;
  StringRef capturedExpression_18;
  double local_120;
  AssertionHandler catchAssertionHandler_3;
  undefined1 local_d0 [8];
  undefined8 local_c8;
  char *local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8 [2];
  ITransientExpression local_98;
  double *local_88;
  WithinRelMatcher *local_80;
  SquareMatrix stuff;
  
  catchAssertionHandler_3.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/ScatteringRadiusCovariances/test/ScatteringRadiusCovariances.test.cpp"
  ;
  catchAssertionHandler_3.m_assertionInfo.macroName.m_size = 0x67;
  macroName.m_size = 5;
  macroName.m_start = "CHECK";
  capturedExpression.m_size = 0xf;
  capturedExpression.m_start = "3 == chunk.NI()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&stuff,macroName,(SourceLineInfo *)&catchAssertionHandler_3,
             capturedExpression,ContinueOnFailure);
  iVar1 = (int)(((long)(chunk->ni_).
                       super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(chunk->ni_).
                      super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x50);
  catchAssertionHandler_3.m_assertionInfo.macroName.m_size._0_2_ = CONCAT11(iVar1 == 3,1);
  catchAssertionHandler_3.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001cb2e8;
  catchAssertionHandler_3.m_assertionInfo.macroName.m_size =
       CONCAT44(3,(undefined4)catchAssertionHandler_3.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_3.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_3.m_assertionInfo.lineInfo.line = 2;
  catchAssertionHandler_3.m_assertionInfo.capturedExpression.m_start =
       (char *)CONCAT44(catchAssertionHandler_3.m_assertionInfo.capturedExpression.m_start._4_4_,
                        iVar1);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&stuff,(ITransientExpression *)&catchAssertionHandler_3);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_3);
  Catch::AssertionHandler::complete((AssertionHandler *)&stuff);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&stuff);
  catchAssertionHandler_3.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/ScatteringRadiusCovariances/test/ScatteringRadiusCovariances.test.cpp"
  ;
  catchAssertionHandler_3.m_assertionInfo.macroName.m_size = 0x68;
  macroName_00.m_size = 5;
  macroName_00.m_start = "CHECK";
  capturedExpression_00.m_size = 0x1d;
  capturedExpression_00.m_start = "3 == chunk.numberDataBlocks()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&stuff,macroName_00,(SourceLineInfo *)&catchAssertionHandler_3,
             capturedExpression_00,ContinueOnFailure);
  iVar1 = (int)(((long)(chunk->ni_).
                       super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(chunk->ni_).
                      super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>_>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0x50);
  catchAssertionHandler_3.m_assertionInfo.macroName.m_size._0_2_ = CONCAT11(iVar1 == 3,1);
  catchAssertionHandler_3.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001cb2e8;
  catchAssertionHandler_3.m_assertionInfo.macroName.m_size =
       CONCAT44(3,(undefined4)catchAssertionHandler_3.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_3.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_3.m_assertionInfo.lineInfo.line = 2;
  catchAssertionHandler_3.m_assertionInfo.capturedExpression.m_start =
       (char *)CONCAT44(catchAssertionHandler_3.m_assertionInfo.capturedExpression.m_start._4_4_,
                        iVar1);
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&stuff,(ITransientExpression *)&catchAssertionHandler_3);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_3);
  Catch::AssertionHandler::complete((AssertionHandler *)&stuff);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&stuff);
  catchAssertionHandler_3.m_assertionInfo.macroName.m_start =
       "/workspace/llm4binary/github/license_c_cmakelists/njoy[P]ENDFtk/src/ENDFtk/section/32/151/ScatteringRadiusCovariances/test/ScatteringRadiusCovariances.test.cpp"
  ;
  catchAssertionHandler_3.m_assertionInfo.macroName.m_size = 0x69;
  macroName_01.m_size = 5;
  macroName_01.m_start = "CHECK";
  capturedExpression_01.m_size = 0x18;
  capturedExpression_01.m_start = "3 == chunk.data().size()";
  Catch::AssertionHandler::AssertionHandler
            ((AssertionHandler *)&stuff,macroName_01,(SourceLineInfo *)&catchAssertionHandler_3,
             capturedExpression_01,ContinueOnFailure);
  lVar3 = (long)(chunk->ni_).
                super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(chunk->ni_).
                super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  catchAssertionHandler_3.m_assertionInfo.capturedExpression.m_start = (char *)(lVar3 / 0x50);
  catchAssertionHandler_3.m_assertionInfo.macroName.m_size._0_2_ = CONCAT11(lVar3 == 0xf0,1);
  catchAssertionHandler_3.m_assertionInfo.macroName.m_start =
       (char *)&PTR_streamReconstructedExpression_001cb328;
  catchAssertionHandler_3.m_assertionInfo.macroName.m_size =
       CONCAT44(3,(undefined4)catchAssertionHandler_3.m_assertionInfo.macroName.m_size);
  catchAssertionHandler_3.m_assertionInfo.lineInfo.file = "==";
  catchAssertionHandler_3.m_assertionInfo.lineInfo.line = 2;
  Catch::AssertionHandler::handleExpr
            ((AssertionHandler *)&stuff,(ITransientExpression *)&catchAssertionHandler_3);
  Catch::ITransientExpression::~ITransientExpression
            ((ITransientExpression *)&catchAssertionHandler_3);
  Catch::AssertionHandler::complete((AssertionHandler *)&stuff);
  Catch::AssertionHandler::~AssertionHandler((AssertionHandler *)&stuff);
  pLVar2 = &std::
            get<1ul,njoy::ENDFtk::section::CovariancePairs,njoy::ENDFtk::section::SquareMatrix,njoy::ENDFtk::section::RectangularMatrix>
                      ((chunk->ni_).
                       super__Vector_base<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>,_std::allocator<std::variant<njoy::ENDFtk::section::CovariancePairs,_njoy::ENDFtk::section::SquareMatrix,_njoy::ENDFtk::section::RectangularMatrix>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->super_ListRecord;
  njoy::ENDFtk::ListRecord::ListRecord(&stuff.super_ListRecord,pLVar2);
  local_d0 = (undefined1  [8])0x17e484;
  local_c8 = (pointer)0x6e;
  macroName_02.m_size = 5;
  macroName_02.m_start = "CHECK";
  capturedExpression_02.m_size = 0xf;
  capturedExpression_02.m_start = "0 == stuff.LS()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_3,macroName_02,(SourceLineInfo *)local_d0,capturedExpression_02,
             ContinueOnFailure);
  local_c8._1_1_ =
       (int)stuff.super_ListRecord.metadata.fields.
            super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
            super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
            super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
            _M_head_impl == 0;
  local_c8._0_1_ = true;
  local_d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001cb2e8;
  local_c8 = local_c8 & 0xffffffff;
  local_c0 = "==";
  local_b8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_3,(ITransientExpression *)local_d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler_3);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_3);
  local_d0 = (undefined1  [8])0x17e484;
  local_c8 = (pointer)0x6f;
  macroName_03.m_size = 5;
  macroName_03.m_start = "CHECK";
  capturedExpression_03.m_size = 0x19;
  capturedExpression_03.m_start = "0 == stuff.symmetryFlag()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_3,macroName_03,(SourceLineInfo *)local_d0,capturedExpression_03,
             ContinueOnFailure);
  local_c8._1_1_ =
       (int)stuff.super_ListRecord.metadata.fields.
            super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
            super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
            super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Head_base<2UL,_long,_false>.
            _M_head_impl == 0;
  local_c8._0_1_ = true;
  local_d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001cb2e8;
  local_c8 = local_c8 & 0xffffffff;
  local_c0 = "==";
  local_b8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_3,(ITransientExpression *)local_d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler_3);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_3);
  local_d0 = (undefined1  [8])0x17e484;
  local_c8 = (pointer)0x70;
  macroName_04.m_size = 5;
  macroName_04.m_start = "CHECK";
  capturedExpression_04.m_size = 0x14;
  capturedExpression_04.m_start = "!stuff.isSymmetric()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_3,macroName_04,(SourceLineInfo *)local_d0,capturedExpression_04,
             ContinueOnFailure);
  local_d0[0] = (int)stuff.super_ListRecord.metadata.fields.
                     super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                     super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                     super__Tuple_impl<2UL,_long,_long,_long,_long>.
                     super__Head_base<2UL,_long,_false>._M_head_impl == 0;
  Catch::AssertionHandler::handleExpr<bool>(&catchAssertionHandler_3,(ExprLhs<bool> *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler_3);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_3);
  local_d0 = (undefined1  [8])0x17e484;
  local_c8 = (pointer)0x71;
  macroName_05.m_size = 5;
  macroName_05.m_start = "CHECK";
  capturedExpression_05.m_size = 0xf;
  capturedExpression_05.m_start = "5 == stuff.LB()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_3,macroName_05,(SourceLineInfo *)local_d0,capturedExpression_05,
             ContinueOnFailure);
  local_c8._1_1_ =
       (int)stuff.super_ListRecord.metadata.fields.
            super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
            super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
            super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
            super__Head_base<3UL,_long,_false>._M_head_impl == 5;
  local_c8._0_1_ = true;
  local_d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001cb2e8;
  local_c8._4_4_ = 5;
  local_c0 = "==";
  local_b8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_3,(ITransientExpression *)local_d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler_3);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_3);
  local_d0 = (undefined1  [8])0x17e484;
  local_c8 = (pointer)0x72;
  macroName_06.m_size = 5;
  macroName_06.m_start = "CHECK";
  capturedExpression_06.m_size = 0x16;
  capturedExpression_06.m_start = "5 == stuff.procedure()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_3,macroName_06,(SourceLineInfo *)local_d0,capturedExpression_06,
             ContinueOnFailure);
  local_c8._1_1_ =
       (int)stuff.super_ListRecord.metadata.fields.
            super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
            super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
            super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
            super__Head_base<3UL,_long,_false>._M_head_impl == 5;
  local_c8._0_1_ = true;
  local_d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001cb2e8;
  local_c8._4_4_ = 5;
  local_c0 = "==";
  local_b8[0]._M_allocated_capacity = 2;
  local_b8[0]._8_4_ =
       (int)stuff.super_ListRecord.metadata.fields.
            super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
            super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
            super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
            super__Head_base<3UL,_long,_false>._M_head_impl;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_3,(ITransientExpression *)local_d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler_3);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_3);
  local_d0 = (undefined1  [8])0x17e484;
  local_c8 = (pointer)0x73;
  macroName_07.m_size = 5;
  macroName_07.m_start = "CHECK";
  capturedExpression_07.m_size = 0xf;
  capturedExpression_07.m_start = "7 == stuff.NT()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_3,macroName_07,(SourceLineInfo *)local_d0,capturedExpression_07,
             ContinueOnFailure);
  local_b8[0]._8_8_ =
       (long)stuff.super_ListRecord.data.super__Vector_base<double,_std::allocator<double>_>._M_impl
             .super__Vector_impl_data._M_finish -
       (long)stuff.super_ListRecord.data.super__Vector_base<double,_std::allocator<double>_>._M_impl
             .super__Vector_impl_data._M_start >> 3;
  local_c8._1_1_ =
       (long)stuff.super_ListRecord.data.super__Vector_base<double,_std::allocator<double>_>._M_impl
             .super__Vector_impl_data._M_finish -
       (long)stuff.super_ListRecord.data.super__Vector_base<double,_std::allocator<double>_>._M_impl
             .super__Vector_impl_data._M_start == 0x38;
  local_c8._0_1_ = true;
  local_d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001cb3a8;
  local_c8._4_4_ = 7;
  local_c0 = "==";
  local_b8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_3,(ITransientExpression *)local_d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler_3);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_3);
  local_d0 = (undefined1  [8])0x17e484;
  local_c8 = (pointer)0x74;
  macroName_08.m_size = 5;
  macroName_08.m_start = "CHECK";
  capturedExpression_08.m_size = 0x19;
  capturedExpression_08.m_start = "7 == stuff.numberValues()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_3,macroName_08,(SourceLineInfo *)local_d0,capturedExpression_08,
             ContinueOnFailure);
  local_b8[0]._8_8_ =
       (long)stuff.super_ListRecord.data.super__Vector_base<double,_std::allocator<double>_>._M_impl
             .super__Vector_impl_data._M_finish -
       (long)stuff.super_ListRecord.data.super__Vector_base<double,_std::allocator<double>_>._M_impl
             .super__Vector_impl_data._M_start >> 3;
  local_c8._1_1_ =
       (long)stuff.super_ListRecord.data.super__Vector_base<double,_std::allocator<double>_>._M_impl
             .super__Vector_impl_data._M_finish -
       (long)stuff.super_ListRecord.data.super__Vector_base<double,_std::allocator<double>_>._M_impl
             .super__Vector_impl_data._M_start == 0x38;
  local_c8._0_1_ = true;
  local_d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001cb3a8;
  local_c8._4_4_ = 7;
  local_c0 = "==";
  local_b8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_3,(ITransientExpression *)local_d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler_3);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_3);
  local_d0 = (undefined1  [8])0x17e484;
  local_c8 = (pointer)0x75;
  macroName_09.m_size = 5;
  macroName_09.m_start = "CHECK";
  capturedExpression_09.m_size = 0xf;
  capturedExpression_09.m_start = "3 == stuff.NE()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_3,macroName_09,(SourceLineInfo *)local_d0,capturedExpression_09,
             ContinueOnFailure);
  local_c8._1_1_ =
       stuff.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.
       super__Head_base<5UL,_long,_false>._M_head_impl == 3;
  local_c8._0_1_ = true;
  local_d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001cb3a8;
  local_c8._4_4_ = 3;
  local_c0 = "==";
  local_b8[0]._M_allocated_capacity = 2;
  local_b8[0]._8_8_ =
       stuff.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.
       super__Head_base<5UL,_long,_false>._M_head_impl;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_3,(ITransientExpression *)local_d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler_3);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_3);
  local_d0 = (undefined1  [8])0x17e484;
  local_c8 = (pointer)0x76;
  macroName_10.m_size = 5;
  macroName_10.m_start = "CHECK";
  capturedExpression_10.m_size = 0x1b;
  capturedExpression_10.m_start = "3 == stuff.numberEnergies()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_3,macroName_10,(SourceLineInfo *)local_d0,capturedExpression_10,
             ContinueOnFailure);
  local_c8._1_1_ =
       stuff.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.
       super__Head_base<5UL,_long,_false>._M_head_impl == 3;
  local_c8._0_1_ = true;
  local_d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001cb3a8;
  local_c8._4_4_ = 3;
  local_c0 = "==";
  local_b8[0]._M_allocated_capacity = 2;
  local_b8[0]._8_8_ =
       stuff.super_ListRecord.metadata.fields.
       super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
       super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
       super__Tuple_impl<2UL,_long,_long,_long,_long>.super__Tuple_impl<3UL,_long,_long,_long>.
       super__Tuple_impl<4UL,_long,_long>.super__Tuple_impl<5UL,_long>.
       super__Head_base<5UL,_long,_false>._M_head_impl;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_3,(ITransientExpression *)local_d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler_3);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_3);
  local_d0 = (undefined1  [8])0x17e484;
  local_c8 = (pointer)0x79;
  macroName_11.m_size = 10;
  macroName_11.m_start = "CHECK_THAT";
  capturedExpression_11.m_size = 0x24;
  capturedExpression_11.m_start = "0., WithinRel( stuff.energies()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_3,macroName_11,(SourceLineInfo *)local_d0,capturedExpression_11,
             ContinueOnFailure);
  local_120 = 0.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d0,
             *stuff.super_ListRecord.data.super__Vector_base<double,_std::allocator<double>_>.
              _M_impl.super__Vector_impl_data._M_start);
  local_98.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d0,&local_120);
  local_98.m_isBinaryExpression = true;
  local_98._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001cb3e8;
  local_88 = &local_120;
  local_80 = (WithinRelMatcher *)local_d0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_3,&local_98);
  Catch::ITransientExpression::~ITransientExpression(&local_98);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler_3);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_3);
  local_d0 = (undefined1  [8])0x17e484;
  local_c8 = (pointer)0x7a;
  macroName_12.m_size = 10;
  macroName_12.m_start = "CHECK_THAT";
  capturedExpression_12.m_size = 0x26;
  capturedExpression_12.m_start = "100., WithinRel( stuff.energies()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_3,macroName_12,(SourceLineInfo *)local_d0,capturedExpression_12,
             ContinueOnFailure);
  local_120 = 100.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d0,
             stuff.super_ListRecord.data.super__Vector_base<double,_std::allocator<double>_>._M_impl
             .super__Vector_impl_data._M_start[1]);
  local_98.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d0,&local_120);
  local_98.m_isBinaryExpression = true;
  local_98._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001cb3e8;
  local_88 = &local_120;
  local_80 = (WithinRelMatcher *)local_d0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_3,&local_98);
  Catch::ITransientExpression::~ITransientExpression(&local_98);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler_3);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_3);
  local_d0 = (undefined1  [8])0x17e484;
  local_c8 = (pointer)0x7b;
  macroName_13.m_size = 10;
  macroName_13.m_start = "CHECK_THAT";
  capturedExpression_13.m_size = 0x26;
  capturedExpression_13.m_start = "200., WithinRel( stuff.energies()[2] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_3,macroName_13,(SourceLineInfo *)local_d0,capturedExpression_13,
             ContinueOnFailure);
  local_120 = 200.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d0,
             stuff.super_ListRecord.data.super__Vector_base<double,_std::allocator<double>_>._M_impl
             .super__Vector_impl_data._M_start[2]);
  local_98.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d0,&local_120);
  local_98.m_isBinaryExpression = true;
  local_98._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001cb3e8;
  local_88 = &local_120;
  local_80 = (WithinRelMatcher *)local_d0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_3,&local_98);
  Catch::ITransientExpression::~ITransientExpression(&local_98);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler_3);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_3);
  local_d0 = (undefined1  [8])0x17e484;
  local_c8 = (pointer)0x7c;
  macroName_14.m_size = 10;
  macroName_14.m_start = "CHECK_THAT";
  capturedExpression_14.m_size = 0x22;
  capturedExpression_14.m_start = "1., WithinRel( stuff.values()[0] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_3,macroName_14,(SourceLineInfo *)local_d0,capturedExpression_14,
             ContinueOnFailure);
  local_120 = 1.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d0,
             stuff.super_ListRecord.data.super__Vector_base<double,_std::allocator<double>_>._M_impl
             .super__Vector_impl_data._M_start
             [(long)stuff.super_ListRecord.metadata.fields.
                    super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                    super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                    super__Tuple_impl<2UL,_long,_long,_long,_long>.
                    super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>.
                    super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>._M_head_impl]);
  local_98.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d0,&local_120);
  local_98.m_isBinaryExpression = true;
  local_98._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001cb3e8;
  local_88 = &local_120;
  local_80 = (WithinRelMatcher *)local_d0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_3,&local_98);
  Catch::ITransientExpression::~ITransientExpression(&local_98);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler_3);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_3);
  local_d0 = (undefined1  [8])0x17e484;
  local_c8 = (pointer)0x7d;
  macroName_15.m_size = 10;
  macroName_15.m_start = "CHECK_THAT";
  capturedExpression_15.m_size = 0x22;
  capturedExpression_15.m_start = "2., WithinRel( stuff.values()[1] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_3,macroName_15,(SourceLineInfo *)local_d0,capturedExpression_15,
             ContinueOnFailure);
  local_120 = 2.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d0,
             stuff.super_ListRecord.data.super__Vector_base<double,_std::allocator<double>_>._M_impl
             .super__Vector_impl_data._M_start
             [(long)stuff.super_ListRecord.metadata.fields.
                    super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                    super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                    super__Tuple_impl<2UL,_long,_long,_long,_long>.
                    super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>.
                    super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>._M_head_impl + 1
             ]);
  local_98.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d0,&local_120);
  local_98.m_isBinaryExpression = true;
  local_98._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001cb3e8;
  local_88 = &local_120;
  local_80 = (WithinRelMatcher *)local_d0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_3,&local_98);
  Catch::ITransientExpression::~ITransientExpression(&local_98);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler_3);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_3);
  local_d0 = (undefined1  [8])0x17e484;
  local_c8 = (pointer)0x7e;
  macroName_16.m_size = 10;
  macroName_16.m_start = "CHECK_THAT";
  capturedExpression_16.m_size = 0x22;
  capturedExpression_16.m_start = "3., WithinRel( stuff.values()[2] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_3,macroName_16,(SourceLineInfo *)local_d0,capturedExpression_16,
             ContinueOnFailure);
  local_120 = 3.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d0,
             stuff.super_ListRecord.data.super__Vector_base<double,_std::allocator<double>_>._M_impl
             .super__Vector_impl_data._M_start
             [(long)stuff.super_ListRecord.metadata.fields.
                    super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                    super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                    super__Tuple_impl<2UL,_long,_long,_long,_long>.
                    super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>.
                    super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>._M_head_impl + 2
             ]);
  local_98.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d0,&local_120);
  local_98.m_isBinaryExpression = true;
  local_98._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001cb3e8;
  local_88 = &local_120;
  local_80 = (WithinRelMatcher *)local_d0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_3,&local_98);
  Catch::ITransientExpression::~ITransientExpression(&local_98);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler_3);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_3);
  local_d0 = (undefined1  [8])0x17e484;
  local_c8 = (pointer)0x7f;
  macroName_17.m_size = 10;
  macroName_17.m_start = "CHECK_THAT";
  capturedExpression_17.m_size = 0x22;
  capturedExpression_17.m_start = "4., WithinRel( stuff.values()[3] )";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_3,macroName_17,(SourceLineInfo *)local_d0,capturedExpression_17,
             ContinueOnFailure);
  local_120 = 4.0;
  Catch::Matchers::WithinRel
            ((WithinRelMatcher *)local_d0,
             stuff.super_ListRecord.data.super__Vector_base<double,_std::allocator<double>_>._M_impl
             .super__Vector_impl_data._M_start
             [(long)stuff.super_ListRecord.metadata.fields.
                    super__Tuple_impl<0UL,_double,_double,_long,_long,_long,_long>.
                    super__Tuple_impl<1UL,_double,_long,_long,_long,_long>.
                    super__Tuple_impl<2UL,_long,_long,_long,_long>.
                    super__Tuple_impl<3UL,_long,_long,_long>.super__Tuple_impl<4UL,_long,_long>.
                    super__Tuple_impl<5UL,_long>.super__Head_base<5UL,_long,_false>._M_head_impl + 3
             ]);
  local_98.m_result =
       Catch::Matchers::WithinRelMatcher::match((WithinRelMatcher *)local_d0,&local_120);
  local_98.m_isBinaryExpression = true;
  local_98._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_001cb3e8;
  local_88 = &local_120;
  local_80 = (WithinRelMatcher *)local_d0;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_3,&local_98);
  Catch::ITransientExpression::~ITransientExpression(&local_98);
  Catch::Matchers::MatcherUntypedBase::~MatcherUntypedBase((MatcherUntypedBase *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler_3);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_3);
  local_d0 = (undefined1  [8])0x17e484;
  local_c8 = (pointer)0x81;
  macroName_18.m_size = 5;
  macroName_18.m_start = "CHECK";
  capturedExpression_18.m_size = 0x10;
  capturedExpression_18.m_start = "10 == chunk.NC()";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler_3,macroName_18,(SourceLineInfo *)local_d0,capturedExpression_18,
             ContinueOnFailure);
  local_b8[0]._8_8_ = njoy::ENDFtk::section::Type<32,_151>::ScatteringRadiusCovariances::NC(chunk);
  local_c8._1_1_ = local_b8[0]._8_8_ == 10;
  local_c8._0_1_ = true;
  local_d0 = (undefined1  [8])&PTR_streamReconstructedExpression_001cb3a8;
  local_c8._4_4_ = 10;
  local_c0 = "==";
  local_b8[0]._M_allocated_capacity = 2;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler_3,(ITransientExpression *)local_d0);
  Catch::ITransientExpression::~ITransientExpression((ITransientExpression *)local_d0);
  Catch::AssertionHandler::complete(&catchAssertionHandler_3);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler_3);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&stuff.super_ListRecord.data.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void verifyChunk( const ScatteringRadiusCovariances& chunk ) {

  CHECK( 3 == chunk.NI() );
  CHECK( 3 == chunk.numberDataBlocks() );
  CHECK( 3 == chunk.data().size() );

  auto stuff = std::get< SquareMatrix >( chunk.data()[0] );

  // metadata
  CHECK( 0 == stuff.LS() );
  CHECK( 0 == stuff.symmetryFlag() );
  CHECK( !stuff.isSymmetric() );
  CHECK( 5 == stuff.LB() );
  CHECK( 5 == stuff.procedure() );
  CHECK( 7 == stuff.NT() );
  CHECK( 7 == stuff.numberValues() );
  CHECK( 3 == stuff.NE() );
  CHECK( 3 == stuff.numberEnergies() );

  // values
  CHECK_THAT( 0., WithinRel( stuff.energies()[0] ) );
  CHECK_THAT( 100., WithinRel( stuff.energies()[1] ) );
  CHECK_THAT( 200., WithinRel( stuff.energies()[2] ) );
  CHECK_THAT( 1., WithinRel( stuff.values()[0] ) );
  CHECK_THAT( 2., WithinRel( stuff.values()[1] ) );
  CHECK_THAT( 3., WithinRel( stuff.values()[2] ) );
  CHECK_THAT( 4., WithinRel( stuff.values()[3] ) );

  CHECK( 10 == chunk.NC() );
}